

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O2

void __thiscall SimpleString::setInternalBufferToNewBuffer(SimpleString *this,size_t bufferSize)

{
  char *pcVar1;
  
  deallocateInternalBuffer(this);
  this->bufferSize_ = bufferSize;
  pcVar1 = allocStringBuffer(bufferSize,
                             "/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/build_O2/CMake/cpputest/cpputest-src/src/CppUTest/SimpleString.cpp"
                             ,0x107);
  this->buffer_ = pcVar1;
  *pcVar1 = '\0';
  return;
}

Assistant:

void SimpleString::setInternalBufferToNewBuffer(size_t bufferSize)
{
    deallocateInternalBuffer();

    bufferSize_ = bufferSize;
    buffer_ = allocStringBuffer(bufferSize_, __FILE__, __LINE__);
    buffer_[0] = '\0';
}